

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

int coda_product_definition_add_detection_rule
              (coda_product_definition *product_definition,coda_detection_rule *detection_rule)

{
  int iVar1;
  coda_detection_rule **ppcVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  if (detection_rule->num_entries == 0) {
    coda_set_error(-400,"detection rule for \'%s\' should have at least one entry",
                   product_definition->name);
    iVar3 = -1;
  }
  else {
    detection_rule->product_definition = product_definition;
    iVar1 = coda_detection_tree_add_rule
                      ((void *)(*(long *)(in_FS_OFFSET + -0x18) +
                                (ulong)(product_definition->format +
                                       (uint)(product_definition->format == coda_format_ascii)) * 8
                               + 0x18),detection_rule);
    iVar3 = -1;
    if (iVar1 == 0) {
      ppcVar2 = (coda_detection_rule **)
                realloc(product_definition->detection_rule,
                        (long)product_definition->num_detection_rules * 8 + 8);
      if (ppcVar2 == (coda_detection_rule **)0x0) {
        iVar3 = -1;
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)product_definition->num_detection_rules * 8 + 8,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x186);
      }
      else {
        product_definition->detection_rule = ppcVar2;
        iVar3 = product_definition->num_detection_rules;
        product_definition->num_detection_rules = iVar3 + 1;
        ppcVar2[iVar3] = detection_rule;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int coda_product_definition_add_detection_rule(coda_product_definition *product_definition,
                                               coda_detection_rule *detection_rule)
{
    coda_detection_rule **new_detection_rule;

    if (detection_rule->num_entries == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "detection rule for '%s' should have at least one entry",
                       product_definition->name);
        return -1;
    }

    detection_rule->product_definition = product_definition;

    if (data_dictionary_add_detection_rule(detection_rule) != 0)
    {
        return -1;
    }

    new_detection_rule = realloc(product_definition->detection_rule,
                                 (product_definition->num_detection_rules + 1) * sizeof(coda_detection_rule *));
    if (new_detection_rule == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (product_definition->num_detection_rules + 1) * sizeof(coda_detection_rule *), __FILE__,
                       __LINE__);
        return -1;
    }
    product_definition->detection_rule = new_detection_rule;
    product_definition->num_detection_rules++;
    product_definition->detection_rule[product_definition->num_detection_rules - 1] = detection_rule;

    return 0;
}